

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Signature.cpp
# Opt level: O3

string * __thiscall Kernel::Signature::functionName_abi_cxx11_(Signature *this,int number)

{
  int iVar1;
  string *psVar2;
  undefined1 *puVar3;
  
  if ((*(char *)(Lib::env + 0x913a) == '\0') && ((*(byte *)(Lib::env + 0xa532) & 1) == 0)) {
    if ((this->_foolConstantsDefined == true) && (this->_foolFalse == number)) {
      if (functionName[abi:cxx11](int)::fols_abi_cxx11_ != '\0') {
        return &functionName[abi:cxx11](int)::fols_abi_cxx11_;
      }
      iVar1 = __cxa_guard_acquire(&functionName[abi:cxx11](int)::fols_abi_cxx11_);
      if (iVar1 == 0) {
        return &functionName[abi:cxx11](int)::fols_abi_cxx11_;
      }
      functionName[abi:cxx11](int)::fols_abi_cxx11_._M_dataplus._M_p =
           (pointer)&functionName[abi:cxx11](int)::fols_abi_cxx11_.field_2;
      psVar2 = &functionName[abi:cxx11](int)::fols_abi_cxx11_;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&functionName[abi:cxx11](int)::fols_abi_cxx11_,"$false","");
      __cxa_atexit(std::__cxx11::string::~string,&functionName[abi:cxx11](int)::fols_abi_cxx11_,
                   &__dso_handle);
      puVar3 = &functionName[abi:cxx11](int)::fols_abi_cxx11_;
    }
    else {
      if ((this->_foolConstantsDefined == false) || (this->_foolTrue != number)) goto LAB_005b37da;
      if (functionName[abi:cxx11](int)::troo_abi_cxx11_ != '\0') {
        return &functionName[abi:cxx11](int)::troo_abi_cxx11_;
      }
      iVar1 = __cxa_guard_acquire(&functionName[abi:cxx11](int)::troo_abi_cxx11_);
      if (iVar1 == 0) {
        return &functionName[abi:cxx11](int)::troo_abi_cxx11_;
      }
      functionName[abi:cxx11](int)::troo_abi_cxx11_._M_dataplus._M_p =
           (pointer)&functionName[abi:cxx11](int)::troo_abi_cxx11_.field_2;
      psVar2 = &functionName[abi:cxx11](int)::troo_abi_cxx11_;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&functionName[abi:cxx11](int)::troo_abi_cxx11_,"$true","");
      __cxa_atexit(std::__cxx11::string::~string,&functionName[abi:cxx11](int)::troo_abi_cxx11_,
                   &__dso_handle);
      puVar3 = &functionName[abi:cxx11](int)::troo_abi_cxx11_;
    }
    __cxa_guard_release(puVar3);
  }
  else {
LAB_005b37da:
    psVar2 = &(this->_funs)._stack[number]->_name;
  }
  return &((Symbol *)psVar2)->_name;
}

Assistant:

const std::string& Signature::functionName(int number)
{
  // it is safe to reuse "$true" and "$false" for constants
  // because the user cannot define constants with these names herself
  // and the formula, obtained by toString() with "$true" or "$false"
  // in term position would be syntactically valid in FOOL
  if (!env.options->showFOOL() && isFoolConstantSymbol(false,number)) {
    static std::string fols("$false");
    return fols;
  }
  if (!env.options->showFOOL() && isFoolConstantSymbol(true,number)) { 
    static std::string troo("$true");
    return troo;
  }
  return _funs[number]->name();
}